

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_algebra.hpp
# Opt level: O0

matrix<trng::GF2,_4UL> * trng::operator*(matrix<trng::GF2,_4UL> *a,matrix<trng::GF2,_4UL> *b)

{
  GF2 GVar1;
  unsigned_long *puVar2;
  reference pvVar3;
  matrix<trng::GF2,_4UL> *in_RDI;
  size_type k_end;
  size_type k;
  GF2 sum;
  size_type j_end_1;
  size_type j_1;
  size_type i_1;
  size_type k0;
  size_type j_end;
  size_type j;
  size_type i;
  size_type j0;
  size_type step;
  matrix<trng::GF2,_4UL> *res;
  reference in_stack_fffffffffffffee8;
  undefined7 in_stack_fffffffffffffef0;
  GF2 in_stack_fffffffffffffef7;
  matrix<trng::GF2,_4UL> *in_stack_ffffffffffffff10;
  unsigned_long local_c8 [2];
  ulong local_b8;
  ulong local_b0;
  GF2 local_a1;
  unsigned_long local_a0 [2];
  ulong local_90;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  GF2 local_59;
  unsigned_long local_58 [2];
  ulong local_48;
  ulong local_40;
  ulong local_38;
  ulong local_30;
  undefined8 local_28;
  undefined1 local_19;
  
  local_19 = 0;
  matrix<trng::GF2,_4UL>::matrix(in_stack_ffffffffffffff10);
  local_28 = 0x20;
  for (local_30 = 0; local_30 < 4; local_30 = local_30 + 0x20) {
    for (local_38 = 0; local_38 < 4; local_38 = local_38 + 1) {
      local_40 = local_30;
      local_58[1] = 4;
      local_58[0] = local_30 + 0x20;
      puVar2 = utility::min<unsigned_long>(local_58 + 1,local_58);
      local_48 = *puVar2;
      for (; local_40 < local_48; local_40 = local_40 + 1) {
        GF2::GF2(&local_59,0);
        pvVar3 = matrix<trng::GF2,_4UL>::operator()
                           ((matrix<trng::GF2,_4UL> *)
                            CONCAT17(in_stack_fffffffffffffef7.value,in_stack_fffffffffffffef0),
                            (size_type)in_stack_fffffffffffffee8,0x406b68);
        pvVar3->value = local_59.value;
      }
    }
    for (local_78 = 0; local_78 < 4; local_78 = local_78 + 0x20) {
      for (local_80 = 0; local_80 < 4; local_80 = local_80 + 1) {
        local_88 = local_30;
        local_a0[1] = 4;
        local_a0[0] = local_30 + 0x20;
        puVar2 = utility::min<unsigned_long>(local_a0 + 1,local_a0);
        local_90 = *puVar2;
        for (; local_88 < local_90; local_88 = local_88 + 1) {
          GF2::GF2(&local_a1,0);
          local_b0 = local_78;
          local_c8[1] = 4;
          local_c8[0] = local_78 + 0x20;
          puVar2 = utility::min<unsigned_long>(local_c8 + 1,local_c8);
          local_b8 = *puVar2;
          for (; local_b0 < local_b8; local_b0 = local_b0 + 1) {
            matrix<trng::GF2,_4UL>::operator()
                      ((matrix<trng::GF2,_4UL> *)
                       CONCAT17(in_stack_fffffffffffffef7.value,in_stack_fffffffffffffef0),
                       (size_type)in_stack_fffffffffffffee8,0x406ce5);
            matrix<trng::GF2,_4UL>::operator()
                      ((matrix<trng::GF2,_4UL> *)
                       CONCAT17(in_stack_fffffffffffffef7.value,in_stack_fffffffffffffef0),
                       (size_type)in_stack_fffffffffffffee8,0x406d11);
            operator*((GF2)0x0,(GF2)0x0);
            local_a1 = operator+((GF2)0x0,(GF2)0x0);
          }
          matrix<trng::GF2,_4UL>::operator()
                    ((matrix<trng::GF2,_4UL> *)
                     CONCAT17(in_stack_fffffffffffffef7.value,in_stack_fffffffffffffef0),
                     (size_type)in_stack_fffffffffffffee8,0x406d92);
          GVar1 = operator+((GF2)0x0,(GF2)0x0);
          in_stack_fffffffffffffef7 = GVar1;
          in_stack_fffffffffffffee8 =
               matrix<trng::GF2,_4UL>::operator()
                         ((matrix<trng::GF2,_4UL> *)CONCAT17(GVar1.value,in_stack_fffffffffffffef0),
                          (size_type)in_stack_fffffffffffffee8,0x406de3);
          in_stack_fffffffffffffee8->value = GVar1.value;
        }
      }
    }
  }
  return in_RDI;
}

Assistant:

matrix<T, n> operator*(const matrix<T, n> &a, const matrix<T, n> &b) {
    using size_type = typename matrix<T, n>::size_type;
    matrix<T, n> res;
    const size_type step{32};
    for (size_type j0{0}; j0 < n; j0 += step) {
      for (size_type i{0}; i < n; ++i)
        for (size_type j{j0}, j_end{utility::min(n, j0 + step)}; j < j_end; ++j)
          res(i, j) = T{0};
      for (size_type k0{0}; k0 < n; k0 += step) {
        for (size_type i{0}; i < n; ++i)
          for (size_type j{j0}, j_end{utility::min(n, j0 + step)}; j < j_end; ++j) {
            T sum{0};
            for (size_type k{k0}, k_end{utility::min(n, k0 + step)}; k < k_end; ++k)
              sum = sum + a(i, k) * b(k, j);
            res(i, j) = res(i, j) + sum;
          }
      }
    }
    return res;
  }